

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

void ssh_ecdhkex_m_getpublic(ecdh_key *dh,BinarySink *bs)

{
  BinarySink *bs_00;
  uint8_t val;
  mp_int *in_RAX;
  size_t i;
  _func_char_ptr_ssh_kex_ptr *byte;
  mp_int *x;
  mp_int *local_28;
  
  local_28 = in_RAX;
  ecc_montgomery_get_affine((MontgomeryPoint *)dh[-1].vt,&local_28);
  for (byte = (_func_char_ptr_ssh_kex_ptr *)0x0; byte < (dh[-3].vt)->description; byte = byte + 1) {
    bs_00 = bs->binarysink_;
    val = mp_get_byte(local_28,(size_t)byte);
    BinarySink_put_byte(bs_00,val);
  }
  mp_free(local_28);
  return;
}

Assistant:

static void ssh_ecdhkex_m_getpublic(ecdh_key *dh, BinarySink *bs)
{
    ecdh_key_m *dhm = container_of(dh, ecdh_key_m, ek);
    mp_int *x;
    ecc_montgomery_get_affine(dhm->m_public, &x);
    for (size_t i = 0; i < dhm->curve->fieldBytes; ++i)
        put_byte(bs, mp_get_byte(x, i));
    mp_free(x);
}